

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

optional<n_e_s::core::Pixel> __thiscall n_e_s::core::Ppu::execute(Ppu *this)

{
  bool bVar1;
  optional<n_e_s::core::Pixel> oVar2;
  Ppu *this_local;
  optional<n_e_s::core::Pixel> pixel;
  
  std::optional<n_e_s::core::Pixel>::optional
            ((optional<n_e_s::core::Pixel> *)((long)&this_local + 2));
  bVar1 = is_pre_render_scanline(this);
  if (bVar1) {
    execute_pre_render_scanline(this);
  }
  else {
    bVar1 = is_visible_scanline(this);
    if (bVar1) {
      oVar2 = execute_visible_scanline(this);
      this_local._2_4_ =
           oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
           super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_;
      this_local._6_2_ =
           oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
           super__Optional_payload_base<n_e_s::core::Pixel>._4_2_;
    }
    else {
      bVar1 = is_post_render_scanline(this);
      if (bVar1) {
        execute_post_render_scanline(this);
      }
      else {
        bVar1 = is_vblank_scanline(this);
        if (bVar1) {
          execute_vblank_scanline(this);
        }
      }
    }
  }
  update_counters(this);
  oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._4_2_ = this_local._6_2_;
  oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
  super__Optional_payload_base<n_e_s::core::Pixel>._M_payload._0_4_ = this_local._2_4_;
  return (optional<n_e_s::core::Pixel>)
         oVar2.super__Optional_base<n_e_s::core::Pixel,_true,_true>._M_payload.
         super__Optional_payload_base<n_e_s::core::Pixel>;
}

Assistant:

std::optional<Pixel> Ppu::execute() {
    std::optional<Pixel> pixel;

    if (is_pre_render_scanline()) {
        execute_pre_render_scanline();
    } else if (is_visible_scanline()) {
        pixel = execute_visible_scanline();
    } else if (is_post_render_scanline()) {
        execute_post_render_scanline();
    } else if (is_vblank_scanline()) {
        execute_vblank_scanline();
    }

    update_counters();
    return pixel;
}